

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  j_decompress_ptr in_RSI;
  uchar *in_RDI;
  int blkn;
  int p1;
  uchar *st;
  arith_entropy_ptr entropy;
  int local_28;
  
  lVar2 = *(long *)(in_RDI + 0x250);
  if (*(int *)(in_RDI + 0x170) != 0) {
    if (*(int *)(lVar2 + 0x4c) == 0) {
      process_restart(in_RSI);
    }
    *(int *)(lVar2 + 0x4c) = *(int *)(lVar2 + 0x4c) + -1;
  }
  uVar1 = *(undefined4 *)(in_RDI + 0x218);
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x1e0); local_28 = local_28 + 1) {
    iVar3 = arith_decode(_blkn,in_RDI);
    if (iVar3 != 0) {
      *(ushort *)&(&in_RSI->err)[local_28]->error_exit =
           *(ushort *)&(&in_RSI->err)[local_28]->error_exit | (ushort)(1 << ((byte)uVar1 & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int p1 = 1 << cinfo->Al;      /* 1 in the bit position being coded */
  int blkn;
  JBLOCKROW block;
  BITREAD_STATE_VARS;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* Not worth the cycles to check insufficient_data here,
   * since we will not change the data anyway if we read zeroes.
   */

  /* Load up working state */
  BITREAD_LOAD_STATE(cinfo, entropy->bitstate);

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];

    /* Encoded data is simply the next bit of the two's-complement DC value */
    CHECK_BIT_BUFFER(br_state, 1, return FALSE);
    if (GET_BITS(1))
      (*block)[0] |= p1;
    /* Note: since we use |=, repeating the assignment later is safe */
  }

  /* Completed MCU, so update state */
  BITREAD_SAVE_STATE(cinfo, entropy->bitstate);

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}